

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_ImDrawChannel_resizeT(ImVector_ImDrawChannel *self,int new_size,ImDrawChannel *v)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  ImDrawCmd *pIVar4;
  unsigned_short *puVar5;
  ImDrawChannel *pIVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  iVar2 = self->Capacity;
  if (iVar2 < new_size) {
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar9 <= new_size) {
      iVar9 = new_size;
    }
    if (iVar2 < iVar9) {
      pIVar6 = (ImDrawChannel *)ImGui::MemAlloc((long)iVar9 << 5);
      if (self->Data != (ImDrawChannel *)0x0) {
        memcpy(pIVar6,self->Data,(long)self->Size << 5);
        ImGui::MemFree(self->Data);
      }
      self->Data = pIVar6;
      self->Capacity = iVar9;
    }
  }
  iVar2 = self->Size;
  if (iVar2 < new_size) {
    lVar8 = (long)new_size - (long)iVar2;
    lVar7 = (long)iVar2 << 5;
    do {
      pIVar6 = self->Data;
      uVar3 = *(undefined8 *)&v->_CmdBuffer;
      pIVar4 = (v->_CmdBuffer).Data;
      puVar5 = (v->_IdxBuffer).Data;
      puVar1 = (undefined8 *)((long)&(pIVar6->_IdxBuffer).Size + lVar7);
      *puVar1 = *(undefined8 *)&v->_IdxBuffer;
      puVar1[1] = puVar5;
      puVar1 = (undefined8 *)((long)&(pIVar6->_CmdBuffer).Size + lVar7);
      *puVar1 = uVar3;
      puVar1[1] = pIVar4;
      lVar7 = lVar7 + 0x20;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawChannel_resizeT(ImVector_ImDrawChannel* self,int new_size,const ImDrawChannel v)
{
    return self->resize(new_size,v);
}